

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk84(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk84_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk84.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk84.version);
    if ((bios->power).unk84.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk84.offset + 1,&(bios->power).unk84.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk84.offset + 2,&(bios->power).unk84.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk84.offset + 3,&(bios->power).unk84.entriesnum);
      (bios->power).unk84.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk84.entriesnum;
      peVar5 = (envy_bios_power_unk84_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk84.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk84.rlen * (int)uVar6 +
             (uint)(bios->power).unk84.hlen + (bios->power).unk84.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER MS table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk84(struct envy_bios *bios) {
	struct envy_bios_power_unk84 *unk84 = &bios->power.unk84;
	int i, err = 0;

	if (!unk84->offset)
		return -EINVAL;

	bios_u8(bios, unk84->offset + 0x0, &unk84->version);
	switch(unk84->version) {
	case 0x10:
		err |= bios_u8(bios, unk84->offset + 0x1, &unk84->hlen);
		err |= bios_u8(bios, unk84->offset + 0x2, &unk84->rlen);
		err |= bios_u8(bios, unk84->offset + 0x3, &unk84->entriesnum);
		unk84->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER MS table version 0x%x\n", unk84->version);
		return -EINVAL;
	};

	err = 0;
	unk84->entries = malloc(unk84->entriesnum * sizeof(struct envy_bios_power_unk84_entry));
	for (i = 0; i < unk84->entriesnum; i++) {
		uint32_t data = unk84->offset + unk84->hlen + i * unk84->rlen;

		unk84->entries[i].offset = data;
	}

	return 0;
}